

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_setuservalue(lua_State *L,int idx)

{
  lua_CFunction p_Var1;
  TValue *pTVar2;
  StkId pTVar3;
  
  pTVar2 = index2addr(L,idx);
  pTVar3 = L->top;
  p_Var1 = (pTVar2->value_).f;
  *(Value *)(p_Var1 + 0x20) = pTVar3[-1].value_;
  p_Var1[10] = *(code *)&pTVar3[-1].tt_;
  pTVar3 = L->top;
  if ((((pTVar3[-1].tt_ & 0x40) != 0) && ((((pTVar2->value_).gc)->marked & 4) != 0)) &&
     (((pTVar3[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrier_(L,(pTVar2->value_).gc,pTVar3[-1].value_.gc);
    pTVar3 = L->top;
  }
  L->top = pTVar3 + -1;
  return;
}

Assistant:

LUA_API void lua_setuservalue (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  setuservalue(L, uvalue(o), L->top - 1);
  luaC_barrier(L, gcvalue(o), L->top - 1);
  L->top--;
  lua_unlock(L);
}